

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzer.cpp
# Opt level: O0

void __thiscall ModbusAnalyzer::ModbusAnalyzer(ModbusAnalyzer *this)

{
  ModbusAnalyzerSettings *this_00;
  ModbusAnalyzer *this_local;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__ModbusAnalyzer_00134ca0;
  this_00 = (ModbusAnalyzerSettings *)operator_new(0x78);
  ModbusAnalyzerSettings::ModbusAnalyzerSettings(this_00);
  std::auto_ptr<ModbusAnalyzerSettings>::auto_ptr(&this->mSettings,this_00);
  std::auto_ptr<ModbusAnalyzerResults>::auto_ptr(&this->mResults,(element_type *)0x0);
  ModbusSimulationDataGenerator::ModbusSimulationDataGenerator(&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->mSampleOffsets);
  std::auto_ptr<ModbusAnalyzerSettings>::get(&this->mSettings);
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  init_crc16_tab(this);
  return;
}

Assistant:

ModbusAnalyzer::ModbusAnalyzer() : Analyzer2(), mSettings( new ModbusAnalyzerSettings() ), mSimulationInitilized( false )
{
    SetAnalyzerSettings( mSettings.get() );

    // used for calculating Modbus Checksum values
    init_crc16_tab();
}